

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

gboolean watch_jacklistener(GList **players)

{
  long lVar1;
  GError *error;
  
  error = (GError *)0x0;
  lVar1 = g_bus_get_sync(1,0,&error);
  if ((lVar1 != 0) &&
     (lVar1 = g_dbus_proxy_new_sync
                        (lVar1,0,0,"org.ude.jacklistener","/jack/headphone","org.ude.jacklistener",0
                         ,&error), lVar1 != 0)) {
    g_signal_connect_data(lVar1,"g-signal",on_jacklistener_signal,players,0,0);
    return 0;
  }
  g_log(0,8,"%s",error->message);
  g_error_free(error);
  return 0;
}

Assistant:

gboolean
watch_jacklistener(GList** players)
{
  GError *error = NULL;
  GDBusConnection *bus = g_bus_get_sync(G_BUS_TYPE_SYSTEM, NULL, &error);

  if (!bus) {
    g_critical("%s", error->message);
    g_error_free(error);
    return FALSE;
  }

  GDBusProxy* headphone = g_dbus_proxy_new_sync(bus,
                                                G_DBUS_PROXY_FLAGS_NONE,
                                                NULL, // interface info, XXX
                                                "org.ude.jacklistener",
                                                "/jack/headphone",
                                                "org.ude.jacklistener",
                                                NULL, // cancellable
                                                &error);
  if (!headphone) {
    g_critical("%s", error->message);
    g_error_free(error);
    return FALSE;
  }

  g_signal_connect(headphone, "g-signal", G_CALLBACK(on_jacklistener_signal), players);
}